

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_read_line(int ignore_blank_lines)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  int nc;
  int local_38;
  int local_34;
  
  if (0 < ngp_inclevel) {
    if (10 < ngp_inclevel) {
      return 0x16d;
    }
    if (ngp_fp[ngp_inclevel - 1] == (FILE *)0x0) {
      return 0x16a;
    }
    _local_38 = CONCAT44(ignore_blank_lines,in_EAX);
    do {
      while (iVar2 = ngp_read_line_buffered(*(FILE **)(&DAT_003841f8 + (long)ngp_inclevel * 8)),
            iVar2 == 0) {
        if (((byte)ngp_curline.flags & 1) != 0) {
          return 0;
        }
        if ((*ngp_curline.line != '#') && ((*ngp_curline.line != '\0' || (ignore_blank_lines == 0)))
           ) {
          iVar2 = ngp_extract_tokens(&ngp_curline);
          if (iVar2 != 0) {
            return iVar2;
          }
          if (ngp_curline.name != (char *)0x0) {
            if (*ngp_curline.name != '\0') {
              uVar7 = 0;
              pcVar8 = ngp_curline.name;
              do {
                if ((byte)(pcVar8[uVar7] + 0x9fU) < 0x1a) {
                  pcVar8[uVar7] = pcVar8[uVar7] + -0x20;
                }
                pcVar8 = ngp_curline.name;
                if (uVar7 == 7) break;
                uVar7 = uVar7 + 1;
                sVar5 = strlen(ngp_curline.name);
              } while (uVar7 < sVar5);
            }
            pcVar8 = ngp_curline.name;
            iVar2 = ngp_tkdef[0].code;
            if ((ngp_tkdef[0].code != -1) &&
               (iVar3 = strcmp(ngp_curline.name,ngp_tkdef[0].name), iVar3 != 0)) {
              uVar7 = 1;
              do {
                iVar2 = ngp_tkdef[uVar7].code;
                if (iVar2 == -1) break;
                iVar3 = strcmp(pcVar8,ngp_tkdef[uVar7].name);
                uVar7 = (ulong)((int)uVar7 + 1);
              } while (iVar3 != 0);
            }
            ngp_keyidx = iVar2;
            if (iVar2 != 0) {
              ngp_linkey.type = 0;
              if (ngp_curline.value == (char *)0x0) {
                if (ngp_curline.type == 7) {
                  ngp_linkey.type = 7;
                }
                else {
                  ngp_linkey.type = 6;
                }
                goto LAB_001be740;
              }
              if (ngp_curline.type == 2) {
                ngp_linkey.type = 2;
                ngp_linkey.value.s = ngp_curline.value;
              }
              if ((ngp_linkey.type == 0) &&
                 ((iVar2 = fits_strcasecmp("T",ngp_curline.value), iVar2 == 0 ||
                  (iVar2 = fits_strcasecmp("F",ngp_curline.value), iVar2 == 0)))) {
                ngp_linkey.type = 1;
                iVar2 = fits_strcasecmp("T",ngp_curline.value);
                ngp_linkey.value.b = iVar2 == 0;
              }
              if ((ngp_linkey.type == 0) &&
                 (iVar2 = __isoc99_sscanf(ngp_curline.value,"(%lg,%lg)%n",0x384688,0x384690,
                                          &local_38), iVar2 == 2)) {
                if (((ulong)(byte)ngp_curline.value[local_38] < 0x21) &&
                   ((0x100000601U >> ((ulong)(byte)ngp_curline.value[local_38] & 0x3f) & 1) != 0)) {
                  ngp_linkey.type = 5;
                }
              }
              pcVar8 = ngp_curline.value;
              if (((ngp_linkey.type == 0) &&
                  (pcVar6 = strchr(ngp_curline.value,0x2e), pcVar6 != (char *)0x0)) &&
                 (iVar2 = __isoc99_sscanf(pcVar8,"%lg%n",0x384688), iVar2 == 1)) {
                lVar4 = (long)local_38;
                bVar1 = ngp_curline.value[lVar4];
                if (bVar1 < 0x20) {
                  if ((bVar1 - 9 < 2) || (bVar1 == 0)) {
LAB_001be7ef:
                    ngp_linkey.type = 4;
                  }
                }
                else {
                  if (bVar1 == 0x20) goto LAB_001be7ef;
                  if (bVar1 == 0x44) {
                    ngp_curline.value[lVar4] = 'E';
                    __isoc99_sscanf(ngp_curline.value,"%lg%n",0x384688,&local_38);
                    if (((ulong)(byte)ngp_curline.value[local_38] < 0x21) &&
                       ((0x100000601U >> ((ulong)(byte)ngp_curline.value[local_38] & 0x3f) & 1) != 0
                       )) goto LAB_001be7ef;
                    ngp_curline.value[lVar4] = 'D';
                  }
                }
              }
              if ((ngp_linkey.type == 0) &&
                 (iVar2 = __isoc99_sscanf(ngp_curline.value,"%d%n",0x384688), iVar2 == 1)) {
                if (((ulong)(byte)ngp_curline.value[local_38] < 0x21) &&
                   ((0x100000601U >> ((ulong)(byte)ngp_curline.value[local_38] & 0x3f) & 1) != 0)) {
                  ngp_linkey.type = 3;
                }
              }
              if (ngp_linkey.type == 0) {
                ngp_linkey.type = 2;
                ngp_linkey.value.s = ngp_curline.value;
              }
LAB_001be740:
              if (ngp_curline.comment == (char *)0x0) {
                ngp_linkey.comment[0] = '\0';
              }
              else {
                strncpy(ngp_linkey.comment,ngp_curline.comment,0x50);
                ngp_linkey.comment[0x4f] = '\0';
              }
              strncpy(ngp_linkey.name,ngp_curline.name,0x4b);
              ngp_linkey.name[0x4a] = '\0';
              sVar5 = strlen(ngp_linkey.name);
              if (0x4b < sVar5) {
                return 0x170;
              }
              return 0;
            }
            iVar2 = ngp_include_file(ngp_curline.value);
            ignore_blank_lines = local_34;
            if (iVar2 != 0) {
              return iVar2;
            }
          }
        }
      }
      if (iVar2 != 0x16f) {
        return iVar2;
      }
      lVar4 = (long)ngp_inclevel;
      ngp_inclevel = ngp_inclevel + -1;
      if (*(FILE **)(&DAT_003841f8 + lVar4 * 8) != (FILE *)0x0) {
        fclose(*(FILE **)(&DAT_003841f8 + lVar4 * 8));
      }
      lVar4 = (long)ngp_inclevel;
      ngp_fp[lVar4] = (FILE *)0x0;
    } while (0 < lVar4);
  }
  ngp_keyidx = 5;
  return 0;
}

Assistant:

int	ngp_read_line(int ignore_blank_lines)
 { int r, nc, savec;
   unsigned k;

   if (ngp_inclevel <= 0)		/* do some sanity checking first */
     { ngp_keyidx = NGP_TOKEN_EOF;	/* no parents, so report error */
       return(NGP_OK);	
     }
   if (ngp_inclevel > NGP_MAX_INCLUDE)  return(NGP_INC_NESTING);
   if (NULL == ngp_fp[ngp_inclevel - 1]) return(NGP_NUL_PTR);

   for (;;)
    { switch (r = ngp_read_line_buffered(ngp_fp[ngp_inclevel - 1]))
       { case NGP_EOF:
		ngp_inclevel--;			/* end of file, revert to parent */
		if (ngp_fp[ngp_inclevel])	/* we can close old file */
		  fclose(ngp_fp[ngp_inclevel]);

		ngp_fp[ngp_inclevel] = NULL;
		if (ngp_inclevel <= 0)
		  { ngp_keyidx = NGP_TOKEN_EOF;	/* no parents, so report error */
		    return(NGP_OK);	
		  }
		continue;

	 case NGP_OK:
		if (ngp_curline.flags & NGP_LINE_REREAD) return(r);
		break;
	 default:
		return(r);
       }
      
      switch (ngp_curline.line[0])
       { case 0: if (0 == ignore_blank_lines) break; /* ignore empty lines if told so */
         case '#': continue;			/* ignore comment lines */
       }
      
      r = ngp_extract_tokens(&ngp_curline);	/* analyse line, extract tokens and comment */
      if (NGP_OK != r) return(r);

      if (NULL == ngp_curline.name)  continue;	/* skip lines consisting only of whitespaces */

      for (k = 0; k < strlen(ngp_curline.name); k++)
       { if ((ngp_curline.name[k] >= 'a') && (ngp_curline.name[k] <= 'z')) 
           ngp_curline.name[k] += 'A' - 'a';	/* force keyword to be upper case */
         if (k == 7) break;  /* only first 8 chars are required to be upper case */
       }

      for (k=0;; k++)				/* find index of keyword in keyword table */
       { if (NGP_TOKEN_UNKNOWN == ngp_tkdef[k].code) break;
         if (0 == strcmp(ngp_curline.name, ngp_tkdef[k].name)) break;
       }

      ngp_keyidx = ngp_tkdef[k].code;		/* save this index, grammar parser will need this */

      if (NGP_TOKEN_INCLUDE == ngp_keyidx)	/* if this is \INCLUDE keyword, try to include file */
        { if (NGP_OK != (r = ngp_include_file(ngp_curline.value))) return(r);
	  continue;				/* and read next line */
        }

      ngp_linkey.type = NGP_TTYPE_UNKNOWN;	/* now, get the keyword type, it's a long story ... */

      if (NULL != ngp_curline.value)		/* if no value given signal it */
        { if (NGP_TTYPE_STRING == ngp_curline.type)  /* string type test */
            { ngp_linkey.type = NGP_TTYPE_STRING;
              ngp_linkey.value.s = ngp_curline.value;
            }
          if (NGP_TTYPE_UNKNOWN == ngp_linkey.type) /* bool type test */
            { if ((!fits_strcasecmp("T", ngp_curline.value)) || (!fits_strcasecmp("F", ngp_curline.value)))
                { ngp_linkey.type = NGP_TTYPE_BOOL;
                  ngp_linkey.value.b = (fits_strcasecmp("T", ngp_curline.value) ? 0 : 1);
                }
            }
          if (NGP_TTYPE_UNKNOWN == ngp_linkey.type) /* complex type test */
            { if (2 == sscanf(ngp_curline.value, "(%lg,%lg)%n", &(ngp_linkey.value.c.re), &(ngp_linkey.value.c.im), &nc))
                { if ((' ' == ngp_curline.value[nc]) || ('\t' == ngp_curline.value[nc])
                   || ('\n' == ngp_curline.value[nc]) || (0 == ngp_curline.value[nc]))
                    { ngp_linkey.type = NGP_TTYPE_COMPLEX;
                    }
                }
            }
          if (NGP_TTYPE_UNKNOWN == ngp_linkey.type) /* real type test */
            { if (strchr(ngp_curline.value, '.') && (1 == sscanf(ngp_curline.value, "%lg%n", &(ngp_linkey.value.d), &nc)))
                {
		 if ('D' == ngp_curline.value[nc]) {
		   /* test if template used a 'D' rather than an 'E' as the exponent character (added by WDP in 12/2010) */
                   savec = nc;
		   ngp_curline.value[nc] = 'E';
		   sscanf(ngp_curline.value, "%lg%n", &(ngp_linkey.value.d), &nc);
		   if ((' ' == ngp_curline.value[nc]) || ('\t' == ngp_curline.value[nc])
                    || ('\n' == ngp_curline.value[nc]) || (0 == ngp_curline.value[nc]))  {
                       ngp_linkey.type = NGP_TTYPE_REAL;
                     } else {  /* no, this is not a real value */
		       ngp_curline.value[savec] = 'D';  /* restore the original D character */
 		     }
		 } else {
		  if ((' ' == ngp_curline.value[nc]) || ('\t' == ngp_curline.value[nc])
                   || ('\n' == ngp_curline.value[nc]) || (0 == ngp_curline.value[nc]))
                    { ngp_linkey.type = NGP_TTYPE_REAL;
                    }
                 } 
                }
            }
          if (NGP_TTYPE_UNKNOWN == ngp_linkey.type) /* integer type test */
            { if (1 == sscanf(ngp_curline.value, "%d%n", &(ngp_linkey.value.i), &nc))
                { if ((' ' == ngp_curline.value[nc]) || ('\t' == ngp_curline.value[nc])
                   || ('\n' == ngp_curline.value[nc]) || (0 == ngp_curline.value[nc]))
                    { ngp_linkey.type = NGP_TTYPE_INT;
                    }
                }
            }
          if (NGP_TTYPE_UNKNOWN == ngp_linkey.type) /* force string type */
            { ngp_linkey.type = NGP_TTYPE_STRING;
              ngp_linkey.value.s = ngp_curline.value;
            }
        }
      else
        { if (NGP_TTYPE_RAW == ngp_curline.type) ngp_linkey.type = NGP_TTYPE_RAW;
	  else ngp_linkey.type = NGP_TTYPE_NULL;
	}

      if (NULL != ngp_curline.comment)
        { strncpy(ngp_linkey.comment, ngp_curline.comment, NGP_MAX_COMMENT); /* store comment */
	  ngp_linkey.comment[NGP_MAX_COMMENT - 1] = 0;
	}
      else
        { ngp_linkey.comment[0] = 0;
        }

      strncpy(ngp_linkey.name, ngp_curline.name, NGP_MAX_NAME); /* and keyword's name */
      ngp_linkey.name[NGP_MAX_NAME - 1] = 0;

      if (strlen(ngp_linkey.name) > FLEN_KEYWORD)  /* WDP: 20-Jun-2002:  mod to support HIERARCH */
        { 
           return(NGP_BAD_ARG);		/* cfitsio does not allow names > 8 chars */
        }
      
      return(NGP_OK);			/* we have valid non empty line, so return success */
    }
 }